

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void slang::ast::ParameterSymbol::fromSyntax
               (Scope *scope,ParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::ParameterSymbol_*> *results)

{
  undefined1 *puVar1;
  DeclaratorSyntax *decl;
  Compilation *this;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  ParameterSymbol *this_00;
  DiagCode code;
  long lVar3;
  SourceLocation loc;
  ParameterSymbol *param;
  bool local_6a;
  bool local_69;
  Scope *local_68;
  SourceLocation local_60;
  ParameterDeclarationSyntax *local_58;
  SmallVectorBase<slang::ast::ParameterSymbol_*> *local_50;
  ulong local_48;
  string_view local_40;
  
  local_48 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < local_48) {
    local_48 = local_48 >> 1;
    lVar3 = 0;
    local_6a = isPort;
    local_69 = isLocal;
    local_68 = scope;
    local_58 = syntax;
    local_50 = results;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar3));
      decl = (DeclaratorSyntax *)*ppSVar2;
      local_60 = parsing::Token::location(&decl->name);
      this = local_68->compilation;
      local_40 = parsing::Token::valueText(&decl->name);
      this_00 = BumpAllocator::
                emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&,bool&,bool&>
                          (&this->super_BumpAllocator,&local_40,&local_60,&local_69,&local_6a);
      local_40._M_len = (size_t)this_00;
      (this_00->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
      puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
      if (decl->initializer == (EqualsValueClauseSyntax *)0x0) {
        if (local_6a == false) {
          code.subsystem = Declarations;
          code.code = 0xe;
        }
        else {
          if (local_69 != true) goto LAB_002266bb;
          code.subsystem = Declarations;
          code.code = 0x6a;
        }
        Scope::addDiag(local_68,code,local_60);
      }
LAB_002266bb:
      SmallVectorBase<slang::ast::ParameterSymbol*>::
      emplace_back<slang::ast::ParameterSymbol*const&>
                ((SmallVectorBase<slang::ast::ParameterSymbol*> *)local_50,
                 (ParameterSymbol **)&local_40);
      lVar3 = lVar3 + 0x30;
      local_48 = local_48 - 1;
    } while (local_48 != 0);
  }
  return;
}

Assistant:

void ParameterSymbol::fromSyntax(const Scope& scope, const ParameterDeclarationSyntax& syntax,
                                 bool isLocal, bool isPort,
                                 SmallVectorBase<ParameterSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<ParameterSymbol>(decl->name.valueText(), loc,
                                                                     isLocal, isPort);
        param->setDeclaredType(*syntax.type);
        param->setFromDeclarator(*decl);

        if (!decl->initializer) {
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }

        results.push_back(param);
    }
}